

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void __thiscall UCAFL::_afl_setup(UCAFL *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  uint8_t *puVar6;
  cmp_map *pcVar7;
  bool bVar8;
  uint32_t uVar9;
  double extraout_XMM0_Qa;
  double __x;
  double dVar10;
  double extraout_XMM0_Qa_00;
  
  pcVar3 = getenv("__AFL_SHM_ID");
  pcVar4 = getenv("AFL_INST_RATIO");
  this->wifsignaled_ = 1;
  uVar9 = 0x10000;
  if (pcVar4 != (char *)0x0) {
    lVar5 = atol(pcVar4);
    uVar1 = (uint)lVar5;
    if (uVar1 < 0x65) {
      uVar9 = ((uVar1 + (uVar1 == 0)) * 0x10000) / 100;
    }
  }
  this->afl_inst_rms_ = uVar9;
  if (pcVar3 == (char *)0x0) {
    _afl_setup(this);
  }
  else {
    iVar2 = atoi(pcVar3);
    puVar6 = (uint8_t *)shmat(iVar2,(void *)0x0,0);
    this->afl_area_ptr_ = puVar6;
    dVar10 = extraout_XMM0_Qa;
    if (puVar6 == (uint8_t *)0xffffffffffffffff) goto LAB_0010301a;
    this->has_afl_ = true;
    *puVar6 = '\x01';
  }
  pcVar3 = getenv("__AFL_CMPLOG_SHM_ID");
  pcVar4 = getenv("UNICORN_AFL_CMPCOV");
  this->has_cmpcov_ = pcVar4 != (char *)0x0;
  if (pcVar3 == (char *)0x0) {
    bVar8 = false;
  }
  else {
    if (pcVar4 != (char *)0x0) {
      dVar10 = log(__x);
      log(dVar10);
      this->has_cmpcov_ = false;
    }
    iVar2 = atoi(pcVar3);
    pcVar7 = (cmp_map *)shmat(iVar2,(void *)0x0,0);
    this->cmpmap_ = pcVar7;
    bVar8 = true;
    dVar10 = extraout_XMM0_Qa_00;
    if (pcVar7 == (cmp_map *)0xffffffffffffffff) {
LAB_0010301a:
      log(dVar10);
      exit(0);
    }
  }
  this->has_cmplog_ = bVar8;
  return;
}

Assistant:

void _afl_setup() {
        char* map_id_str = getenv(SHM_ENV_VAR);
        char* inst_r_str = getenv("AFL_INST_RATIO");

        this->_setup_valid_wifsignaled();

        if (inst_r_str) {
            uint32_t r = atol(inst_r_str);

            if (r > 100) {
                r = 100;
            } else if (r == 0) {
                r = 1;
            }

            this->afl_inst_rms_ = MAP_SIZE * r / 100;
        } else {
            this->afl_inst_rms_ = MAP_SIZE;
        }

        if (likely(map_id_str)) {
            int map_id = atoi(map_id_str);

            this->afl_area_ptr_ = (uint8_t*)shmat(map_id, NULL, 0);

            if (this->afl_area_ptr_ == (void*)-1) {
                ERR("Can't get the afl mapping area.\n");
                exit(0);
            }

            this->has_afl_ = true;

            // Don't let our parent give up on us.
            this->afl_area_ptr_[0] = 1;
        } else {
            this->afl_area_ptr_ =
                (uint8_t*)mmap(NULL, MAP_SIZE, PROT_READ | PROT_WRITE,
                               MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

            if (this->afl_area_ptr_ == MAP_FAILED) {
                perror("[!] mmap failed.");
                exit(0);
            }

            this->has_afl_ = false;
        }

        char* cmplog_map_id_str = getenv(CMPLOG_SHM_ENV_VAR);
        this->has_cmpcov_ = !!getenv("UNICORN_AFL_CMPCOV");

        if (cmplog_map_id_str) {
            if (this->has_cmpcov_) {
                ERR("CMPLOG and CMPCOV turned on at the same time!\n");
                ERR("I'll turn off CMPCOV.\n");
                this->has_cmpcov_ = false;
            }

            int cmplog_map_id = atoi(cmplog_map_id_str);
            this->cmpmap_ = (struct cmp_map*)shmat(cmplog_map_id, NULL, 0);

            if (this->cmpmap_ == (void*)-1) {
                ERR("Can't get the afl cmp-mapping area.\n");
                exit(0);
            }

            this->has_cmplog_ = true;
        } else {
            this->has_cmplog_ = false;
        }
    }